

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

iter_type __thiscall
booster::locale::impl_posix::num_format<char>::do_format_currency
          (num_format<char> *this,bool intl,iter_type out,ios_base *param_4,char_type param_5,
          longdouble val)

{
  ostreambuf_iterator<char,_std::char_traits<char>_> out_00;
  int *piVar1;
  element_type *pp_Var2;
  size_type sVar3;
  num_format<char> *this_00;
  streambuf_type *this_01;
  byte in_CL;
  streambuf_type *in_RDX;
  undefined8 extraout_RDX;
  byte in_SIL;
  ostreambuf_iterator<char,_std::char_traits<char>_> oVar4;
  ostreambuf_iterator<char,_std::char_traits<char>_> oVar5;
  iter_type iVar6;
  longdouble in_stack_00000008;
  vector<char,_std::allocator<char>_> tmp;
  ssize_t n;
  char *format;
  char buf [4];
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  size_t in_stack_fffffffffffffeb8;
  allocator_type *in_stack_fffffffffffffec0;
  num_format<char> *in_stack_fffffffffffffec8;
  streambuf_type *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  allocator<char> *paVar7;
  char *local_118;
  int local_c8;
  allocator<char> local_b1;
  vector<char,_std::allocator<char>_> local_b0;
  streambuf_type *local_88;
  ssize_t local_70;
  char *local_68;
  char local_5c [4];
  longdouble local_58;
  byte local_29;
  streambuf_type *local_20;
  byte bStack_18;
  streambuf_type *local_10;
  ulong local_8;
  
  local_29 = in_SIL & 1;
  local_58 = in_stack_00000008;
  local_20 = in_RDX;
  bStack_18 = in_CL;
  memset(local_5c,0,4);
  if ((local_29 & 1) == 0) {
    local_118 = "%n";
  }
  else {
    local_118 = "%i";
  }
  local_68 = local_118;
  piVar1 = __errno_location();
  *piVar1 = 0;
  pp_Var2 = std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  local_70 = strfmon_l(local_5c,4,(__locale_t)*pp_Var2,local_68,SUB84((double)local_58,0));
  if (local_70 < 0) {
    paVar7 = &local_b1;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffed0,
               (size_type)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    std::allocator<char>::~allocator(&local_b1);
    while( true ) {
      sVar3 = std::vector<char,_std::allocator<char>_>::size(&local_b0);
      if (0x1002 < sVar3) break;
      in_stack_fffffffffffffec0 = (allocator_type *)&local_b0;
      this_00 = (num_format<char> *)
                std::vector<char,_std::allocator<char>_>::front
                          ((vector<char,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
      this_01 = (streambuf_type *)
                std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffec0);
      pp_Var2 = std::
                __shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator*((__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
      local_70 = strfmon_l((char *)this_00,(size_t)this_01,(__locale_t)*pp_Var2,local_68,
                           SUB84((double)local_58,0));
      if (-1 < local_70) {
        std::vector<char,_std::allocator<char>_>::front
                  ((vector<char,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
        oVar5._8_8_ = paVar7;
        oVar5._M_sbuf = this_01;
        oVar5 = write_it(this_00,oVar5,(char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        local_10 = oVar5._M_sbuf;
        local_8 = CONCAT71(local_8._1_7_,oVar5._M_failed);
        local_c8 = 1;
        goto LAB_002893be;
      }
      std::vector<char,_std::allocator<char>_>::size(&local_b0);
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)this_01,(size_type)this_00);
    }
    local_c8 = 2;
LAB_002893be:
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffec0);
    oVar4._8_8_ = extraout_RDX;
    oVar4._M_sbuf = local_10;
    if (local_c8 != 1) {
      oVar4._M_sbuf = local_20;
      local_8 = (ulong)bStack_18;
    }
  }
  else {
    local_88 = local_20;
    out_00._8_8_ = in_stack_fffffffffffffed8;
    out_00._M_sbuf = in_stack_fffffffffffffed0;
    oVar4 = write_it(in_stack_fffffffffffffec8,out_00,(char *)in_stack_fffffffffffffec0,
                     in_stack_fffffffffffffeb8);
    local_8 = (ulong)oVar4._M_failed;
  }
  local_10 = oVar4._M_sbuf;
  iVar6._9_7_ = oVar4._9_7_;
  iVar6._M_failed = (bool)(undefined1)local_8;
  iVar6._M_sbuf = local_10;
  return iVar6;
}

Assistant:

virtual iter_type do_format_currency(bool intl,iter_type out,std::ios_base &/*ios*/,char_type /*fill*/,long double val) const
    {
        char buf[4]={};
        char const *format = intl ? "%i" : "%n";
        errno=0;
        ssize_t n = strfmon_l(buf,sizeof(buf),*lc_,format,static_cast<double>(val));
        if(n >= 0) 
            return write_it(out,buf,n);
        
        for(std::vector<char> tmp(sizeof(buf)*2);tmp.size() <= 4098;tmp.resize(tmp.size()*2)) {
            n = strfmon_l(&tmp.front(),tmp.size(),*lc_,format,static_cast<double>(val));
            if(n >= 0)
                return write_it(out,&tmp.front(),n);
        }
        return out;
    }